

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  PoolAllocatorPrivate *pPVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  ulong uVar7;
  _List_node_base *p_Var8;
  void *ptr;
  _List_node_base *local_30;
  
  pthread_mutex_lock((pthread_mutex_t *)this->d);
  pPVar4 = this->d;
  p_Var5 = (pPVar4->budgets).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var6 = p_Var5;
  p_Var8 = p_Var5;
  for (; p_Var5 != (_List_node_base *)&pPVar4->budgets; p_Var5 = p_Var5->_M_next) {
    p_Var2 = p_Var5[1]._M_next;
    if ((size <= p_Var2) && ((ulong)pPVar4->size_compare_ratio * (long)p_Var2 >> 8 <= size)) {
      p_Var6 = p_Var5[1]._M_prev;
      psVar1 = &(pPVar4->budgets).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x20);
      pthread_mutex_unlock((pthread_mutex_t *)this->d);
      pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
      pPVar4 = this->d;
      p_Var5 = (_List_node_base *)operator_new(0x20);
      p_Var5[1]._M_next = p_Var2;
      p_Var5[1]._M_prev = p_Var6;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(pPVar4->payouts).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      goto LAB_0013a69a;
    }
    if (p_Var2 < p_Var8[1]._M_next) {
      p_Var8 = p_Var5;
    }
    if (p_Var6[1]._M_next < p_Var2) {
      p_Var6 = p_Var5;
    }
  }
  uVar7 = (pPVar4->budgets).
          super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
          ._M_impl._M_node._M_size;
  if (pPVar4->size_drop_threshold <= uVar7) {
    if (p_Var6[1]._M_next < size) {
      p_Var5 = p_Var8[1]._M_prev;
      p_Var6 = p_Var8;
    }
    else {
      if (p_Var8[1]._M_next <= size) goto LAB_0013a636;
      p_Var5 = p_Var6[1]._M_prev;
    }
    if (p_Var5 != (_List_node_base *)0x0) {
      free(p_Var5);
      pPVar4 = this->d;
      uVar7 = (pPVar4->budgets).
              super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              ._M_impl._M_node._M_size;
    }
    (pPVar4->budgets).
    super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
    ._M_impl._M_node._M_size = uVar7 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var6,0x20);
  }
LAB_0013a636:
  pthread_mutex_unlock((pthread_mutex_t *)this->d);
  local_30 = (_List_node_base *)0x0;
  iVar3 = posix_memalign(&local_30,0x40,size + 0x40);
  p_Var6 = (_List_node_base *)0x0;
  if (iVar3 == 0) {
    p_Var6 = local_30;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
  pPVar4 = this->d;
  p_Var5 = (_List_node_base *)operator_new(0x20);
  p_Var5[1]._M_next = (_List_node_base *)size;
  p_Var5[1]._M_prev = p_Var6;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(pPVar4->payouts).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
LAB_0013a69a:
  pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
  return p_Var6;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    d->budgets_lock.lock();

    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin(), it_max = d->budgets.begin(), it_min = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->budgets_lock.unlock();

            d->payouts_lock.lock();

            d->payouts.push_back(std::make_pair(bs, ptr));

            d->payouts_lock.unlock();

            return ptr;
        }

        if (bs < it_min->first)
        {
            it_min = it;
        }
        if (bs > it_max->first)
        {
            it_max = it;
        }
    }

    if (d->budgets.size() >= d->size_drop_threshold)
    {
        // All chunks in pool are not chosen. Then try to drop some outdated
        // chunks and return them to OS.
        if (it_max->first < size)
        {
            // Current query is asking for a chunk larger than any cached chunks.
            // Then remove the smallest one.
            ncnn::fastFree(it_min->second);
            d->budgets.erase(it_min);
        }
        else if (it_min->first > size)
        {
            // Current query is asking for a chunk smaller than any cached chunks.
            // Then remove the largest one.
            ncnn::fastFree(it_max->second);
            d->budgets.erase(it_max);
        }
    }

    d->budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts_lock.lock();

    d->payouts.push_back(std::make_pair(size, ptr));

    d->payouts_lock.unlock();

    return ptr;
}